

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
::
nosize_unchecked_emplace_at<std::pair<slang::ast::ValueSymbol_const*&&,slang::IntervalMap<unsigned_long,std::monostate,3u>&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<const_slang::ast::ValueSymbol_*&&,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_&&>
          *args)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  uint32_t uVar4;
  IntervalMap<unsigned_long,_std::monostate,_3U> *pIVar5;
  uint uVar6;
  ushort uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  unsigned_long uVar11;
  unsigned_long uVar12;
  ulong uVar13;
  group_type_pointer pgVar14;
  long lVar15;
  value_type_pointer ppVar16;
  undefined1 auVar17 [16];
  
  pgVar14 = __return_storage_ptr__->pg;
  uVar13 = (ulong)__return_storage_ptr__->n;
  ppVar16 = __return_storage_ptr__->p;
  lVar15 = 1;
  while( true ) {
    pgVar1 = arrays_->groups_ + pos0;
    pgVar2 = arrays_->groups_ + pos0;
    auVar17[0] = -(pgVar2->m[0].n == '\0');
    auVar17[1] = -(pgVar2->m[1].n == '\0');
    auVar17[2] = -(pgVar2->m[2].n == '\0');
    auVar17[3] = -(pgVar2->m[3].n == '\0');
    auVar17[4] = -(pgVar2->m[4].n == '\0');
    auVar17[5] = -(pgVar2->m[5].n == '\0');
    auVar17[6] = -(pgVar2->m[6].n == '\0');
    auVar17[7] = -(pgVar2->m[7].n == '\0');
    auVar17[8] = -(pgVar2->m[8].n == '\0');
    auVar17[9] = -(pgVar2->m[9].n == '\0');
    auVar17[10] = -(pgVar2->m[10].n == '\0');
    auVar17[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar17[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar17[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar17[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar17[0xf] = -(pgVar2->m[0xf].n == '\0');
    uVar7 = (ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe;
    if (uVar7 == 0) {
      pgVar1->m[0xf].n = pgVar1->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar6 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      uVar13 = (ulong)uVar6;
      ppVar16 = arrays_->elements_;
      ppVar3 = ppVar16 + pos0 * 0xf + uVar13;
      ppVar3->first = *args->first;
      pIVar5 = args->second;
      (ppVar3->second).height = 0;
      (ppVar3->second).rootSize = 0;
      (ppVar3->second).height = pIVar5->height;
      uVar4 = pIVar5->rootSize;
      pIVar5->rootSize = 0;
      (ppVar3->second).rootSize = uVar4;
      if (pIVar5->height == 0) {
        *(undefined8 *)
         &(ppVar3->second).field_0.rootLeaf.
          super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
          field_0x30 = *(undefined8 *)
                        &(pIVar5->field_0).rootLeaf.
                         super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                         .field_0x30;
        uVar8 = (pIVar5->field_0).rootLeaf.
                super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                .first[0].left;
        uVar9 = (pIVar5->field_0).rootLeaf.
                super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                .first[0].right;
        uVar10 = (pIVar5->field_0).rootLeaf.
                 super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                 .first[1].left;
        uVar11 = (pIVar5->field_0).rootLeaf.
                 super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                 .first[1].right;
        uVar12 = (pIVar5->field_0).rootLeaf.
                 super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                 .first[2].right;
        (ppVar3->second).field_0.rootLeaf.
        super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first
        [2].left = (pIVar5->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[2].left;
        (ppVar3->second).field_0.rootLeaf.
        super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first
        [2].right = uVar12;
        (ppVar3->second).field_0.rootLeaf.
        super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first
        [1].left = uVar10;
        (ppVar3->second).field_0.rootLeaf.
        super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first
        [1].right = uVar11;
        (ppVar3->second).field_0.rootLeaf.
        super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first
        [0].left = uVar8;
        (ppVar3->second).field_0.rootLeaf.
        super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first
        [0].right = uVar9;
      }
      else {
        uVar8 = (pIVar5->field_0).rootLeaf.
                super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                .first[0].left;
        uVar9 = (pIVar5->field_0).rootLeaf.
                super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                .first[0].right;
        uVar10 = (pIVar5->field_0).rootLeaf.
                 super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                 .first[1].left;
        uVar11 = (pIVar5->field_0).rootLeaf.
                 super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                 .first[1].right;
        uVar12 = (pIVar5->field_0).rootLeaf.
                 super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                 .first[2].right;
        (ppVar3->second).field_0.rootLeaf.
        super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first
        [2].left = (pIVar5->field_0).rootLeaf.
                   super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                   .first[2].left;
        (ppVar3->second).field_0.rootLeaf.
        super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first
        [2].right = uVar12;
        (ppVar3->second).field_0.rootLeaf.
        super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first
        [1].left = uVar10;
        (ppVar3->second).field_0.rootLeaf.
        super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first
        [1].right = uVar11;
        (ppVar3->second).field_0.rootLeaf.
        super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first
        [0].left = uVar8;
        (ppVar3->second).field_0.rootLeaf.
        super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first
        [0].right = uVar9;
        *(unsigned_long *)&pIVar5->field_0 = 0;
        *(unsigned_long *)((long)&pIVar5->field_0 + 8) = 0;
        ((NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U> *)
        &pIVar5->field_0)->first[1].left = 0;
        ((NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U> *)
        &pIVar5->field_0)->first[1].right = 0;
        ((NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U> *)
        &pIVar5->field_0)->first[2].left = 0;
        ((NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U> *)
        &pIVar5->field_0)->first[2].right = 0;
        *(undefined1 (*) [16])
         ((long)&(pIVar5->field_0).rootLeaf.
                 super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                 .first[2].right + 4) = (undefined1  [16])0x0;
      }
      ppVar16 = ppVar16 + pos0 * 0xf + uVar13;
      pgVar1->m[uVar13].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar14 = pgVar1;
    }
    if (uVar7 != 0) break;
    pos0 = pos0 + lVar15 & arrays_->groups_size_mask;
    lVar15 = lVar15 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar13;
  __return_storage_ptr__->p = ppVar16;
  __return_storage_ptr__->pg = pgVar14;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }